

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_test.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  value_type *__x;
  iterator __first;
  iterator __last;
  basic_ostream<char,_std::char_traits<char>_> *this;
  path local_118;
  reference local_f0;
  directory_entry *m;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  *__range1_1;
  directory_entry *e;
  undefined1 local_a8 [8];
  directory_iterator __end1;
  undefined1 local_88 [8];
  directory_iterator __begin1;
  directory_iterator *__range1;
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  v;
  path local_48;
  undefined1 local_20 [8];
  directory_iterator i;
  
  i._M_dir._M_refcount._M_pi._4_4_ = 0;
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)local_20,&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  memset(&__range1,0,0x18);
  std::
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  ::vector((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
            *)&__range1);
  __begin1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount,
             (directory_iterator *)__begin1._M_dir._M_refcount._M_pi);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_88,(directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&e,(directory_iterator *)__begin1._M_dir._M_refcount._M_pi);
  std::filesystem::__cxx11::end((directory_iterator *)local_a8);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)&e);
  while (bVar1 = std::filesystem::__cxx11::operator!=
                           ((directory_iterator *)local_88,(directory_iterator *)local_a8), bVar1) {
    __x = (value_type *)
          std::filesystem::__cxx11::directory_iterator::operator*((directory_iterator *)local_88);
    std::
    vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
    ::push_back((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                 *)&__range1,__x);
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_88);
  }
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_a8);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_88);
  __first = std::
            vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
            ::begin((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                     *)&__range1);
  __last = std::
           vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
           ::end((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                  *)&__range1);
  std::
  stable_sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>>
            ((__normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>
              )__first._M_current,
             (__normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>
              )__last._M_current);
  __end1_1 = std::
             vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
             ::begin((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                      *)&__range1);
  m = (directory_entry *)
      std::
      vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
      ::end((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
             *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>
                             *)&m), bVar1) {
    local_f0 = __gnu_cxx::
               __normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>
               ::operator*(&__end1_1);
    this = std::filesystem::__cxx11::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,local_f0);
    std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>
    ::operator++(&__end1_1);
  }
  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
            (&local_118,(char (*) [9])"./data/0",auto_format);
  bVar1 = std::filesystem::exists(&local_118);
  std::filesystem::__cxx11::path::~path(&local_118);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"NMSL:");
  }
  std::
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  ::~vector((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
             *)&__range1);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_20);
  return i._M_dir._M_refcount._M_pi._4_4_;
}

Assistant:

int main() {
    auto i = directory_iterator(current_path());
    auto v = vector<directory_entry>{};
    for (auto &e:i) {
        v.push_back(e);
    }
    stable_sort(v.begin(), v.end());
    for (auto &m:v) {
        cout << m << endl;
    }
    if (!exists("./data/0")) {
        cout << "NMSL:";
    }
}